

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

int quorem(Bigint *b,Bigint *S)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ULong *pUVar11;
  ULong *pUVar12;
  ULong *pUVar13;
  ULong *pUVar14;
  ulong uVar15;
  long lVar16;
  ULong *pUVar17;
  
  iVar1 = S->wds;
  lVar6 = (long)iVar1;
  iVar4 = 0;
  if (iVar1 <= b->wds) {
    pUVar11 = S->x;
    uVar10 = lVar6 - 1;
    pUVar12 = S->x + lVar6 + -1;
    pUVar13 = b->x;
    uVar3 = (ulong)b->x[lVar6 + -1] / (ulong)(*pUVar12 + 1);
    iVar4 = (int)uVar3;
    if (*pUVar12 + 1 <= b->x[lVar6 + -1]) {
      lVar7 = 0;
      uVar15 = 0;
      pUVar14 = pUVar11;
      pUVar17 = pUVar13;
      do {
        uVar5 = *pUVar14;
        pUVar14 = pUVar14 + 1;
        uVar8 = uVar5 * uVar3 + uVar15;
        uVar15 = uVar8 >> 0x20;
        lVar16 = ((ulong)*pUVar17 - (uVar8 & 0xffffffff)) + lVar7;
        lVar7 = lVar16 >> 0x20;
        *pUVar17 = (uint)lVar16;
        pUVar17 = pUVar17 + 1;
      } while (pUVar14 <= pUVar12);
      if (b->x[lVar6 + -1] == 0) {
        if (2 < iVar1) {
          lVar6 = lVar6 * 4 + 0x14;
          do {
            if (*(int *)((long)b->x + lVar6 + -0x1c) != 0) break;
            uVar10 = (ulong)((int)uVar10 - 1);
            lVar6 = lVar6 + -4;
          } while (0x1c < lVar6);
        }
        b->wds = (int)uVar10;
      }
    }
    uVar9 = (uint)uVar10;
    uVar5 = b->wds - S->wds;
    if (uVar5 == 0) {
      lVar6 = (long)S->wds * 4 + 0x1c;
      do {
        uVar5 = *(uint *)((long)b->x + lVar6 + -0x20);
        uVar2 = *(uint *)((long)S->x + lVar6 + -0x20);
        if (uVar5 != uVar2) {
          uVar5 = -(uint)(uVar5 < uVar2) | 1;
          goto LAB_00107f4a;
        }
        lVar6 = lVar6 + -4;
      } while (0x1c < lVar6);
      uVar5 = 0;
    }
LAB_00107f4a:
    if (-1 < (int)uVar5) {
      lVar6 = 0;
      do {
        uVar5 = *pUVar11;
        pUVar11 = pUVar11 + 1;
        lVar7 = ((ulong)*pUVar13 - (ulong)uVar5) + lVar6;
        lVar6 = lVar7 >> 0x20;
        *pUVar13 = (uint)lVar7;
        pUVar13 = pUVar13 + 1;
      } while (pUVar11 <= pUVar12);
      iVar4 = iVar4 + 1;
      if (b->x[(int)uVar9] == 0) {
        if (1 < (int)uVar9) {
          lVar6 = (long)(int)uVar9 * 4 + 0x18;
          do {
            uVar9 = (uint)uVar10;
            if (*(int *)((long)b->x + lVar6 + -0x1c) != 0) break;
            uVar9 = uVar9 - 1;
            uVar10 = (ulong)uVar9;
            lVar6 = lVar6 + -4;
          } while (0x1c < lVar6);
        }
        b->wds = uVar9;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
quorem(Bigint *b, Bigint *S)
{
	int n;
	ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
	ULLong borrow, carry, y, ys;
#else
	ULong borrow, carry, y, ys;
#ifdef Pack_32
	ULong si, z, zs;
#endif
#endif

	n = S->wds;
#ifdef DEBUG
	/*debug*/ if (b->wds > n)
	/*debug*/	Bug("oversize b in quorem");
#endif
	if (b->wds < n)
		return 0;
	sx = S->x;
	sxe = sx + --n;
	bx = b->x;
	bxe = bx + n;
	q = *bxe / (*sxe + 1);	/* ensure q <= true quotient */
#ifdef DEBUG
#ifdef NO_STRTOD_BIGCOMP
	/*debug*/ if (q > 9)
#else
	/* An oversized q is possible when quorem is called from bigcomp and */
	/* the input is near, e.g., twice the smallest denormalized number. */
	/*debug*/ if (q > 15)
#endif
	/*debug*/	Bug("oversized quotient in quorem");
#endif
	if (q) {
		borrow = 0;
		carry = 0;
		do {
#ifdef ULLong
			ys = *sx++ * (ULLong)q + carry;
			carry = ys >> 32;
			y = *bx - (ys & FFFFFFFF) - borrow;
			borrow = y >> 32 & (ULong)1;
			*bx++ = y & FFFFFFFF;
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) * q + carry;
			zs = (si >> 16) * q + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ * q + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		if (!*bxe) {
			bx = b->x;
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	if (cmp(b, S) >= 0) {
		q++;
		borrow = 0;
		carry = 0;
		bx = b->x;
		sx = S->x;
		do {
#ifdef ULLong
			ys = *sx++ + carry;
			carry = ys >> 32;
			y = *bx - (ys & FFFFFFFF) - borrow;
			borrow = y >> 32 & (ULong)1;
			*bx++ = y & FFFFFFFF;
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) + carry;
			zs = (si >> 16) + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		bx = b->x;
		bxe = bx + n;
		if (!*bxe) {
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	return q;
	}